

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DGRSubgraphMining.cpp
# Opt level: O0

void dgrminer::find_addition_nodes_and_edges
               (AdjacencyListCrate *adjacency_list,
               vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
               *antecedent_pattern_edges_ADDED,
               vector<int,_std::allocator<int>_> *antecedent_pattern_node_id_ADDED,
               vector<int,_std::allocator<int>_> *antecedent_pattern_node_labels_ADDED,
               map<char,_int,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>
               *from_pattern_id_to_adj_id_map,
               vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_> *adj_list_nodes,
               set<dgrminer::non_dummy_vertices_and_edges,_std::less<dgrminer::non_dummy_vertices_and_edges>,_std::allocator<dgrminer::non_dummy_vertices_and_edges>_>
               *sets_of_used_edges,
               set<int,_std::less<int>,_std::allocator<int>_> *nodes_occupied_by_antecedent,
               set<int,_std::less<int>,_std::allocator<int>_> *edges_occupied_by_antecedent,
               bool debug)

{
  pointer *this;
  _Bit_pointer *ppuVar1;
  value_type vVar2;
  size_t sVar3;
  bool bVar4;
  int iVar5;
  size_type sVar6;
  reference pvVar7;
  mapped_type *pmVar8;
  reference pvVar9;
  reference __x;
  ulong uVar10;
  reference pvVar11;
  reference pvVar12;
  reference rVar13;
  pair<std::_Rb_tree_const_iterator<int>,_bool> pVar14;
  pair<std::_Rb_tree_const_iterator<dgrminer::non_dummy_vertices_and_edges>,_bool> pVar15;
  reference rVar16;
  byte local_3e9;
  reference local_2f0;
  reference local_2e0;
  byte local_2c9;
  int local_2c8;
  value_type vStack_2c4;
  bool was_the_node_dummy_1;
  reference local_2c0;
  value_type local_2b0;
  undefined1 local_2a9;
  undefined1 auStack_2a8 [7];
  bool are_same;
  _Bit_type local_2a0;
  _Self local_298;
  _Self local_290;
  byte local_281;
  int local_280;
  bool is_occupied_by_frequent_pattern;
  int node_candidate_index;
  bool should_try_dummy;
  _Bit_type local_270;
  reference local_268;
  byte local_255;
  int local_254;
  bool was_the_node_dummy;
  _Rb_tree_const_iterator<dgrminer::non_dummy_vertices_and_edges> _Stack_250;
  undefined1 local_248;
  undefined1 local_240 [8];
  non_dummy_vertices_and_edges ndve;
  ulong local_1d0;
  size_t j;
  set<int,_std::less<int>,_std::allocator<int>_> set_of_used_edges;
  size_t i_2;
  reference local_180;
  ulong local_170;
  size_t i_1;
  set<int,_std::less<int>,_std::allocator<int>_> set_of_non_dummy_vertices;
  undefined1 local_120 [8];
  vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
  maximal_set_of_edges;
  vector<std::set<dgrminer::int_pair,_std::less<dgrminer::int_pair>,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::set<dgrminer::int_pair,_std::less<dgrminer::int_pair>,_std::allocator<dgrminer::int_pair>_>_>_>
  edge_mapping_sets;
  ulong local_e8;
  size_t i;
  int local_d8;
  int isolated_vertex_current_index_ADDED;
  int number_of_created_dummy_vertices;
  allocator<bool> local_c2;
  bool local_c1;
  undefined1 local_c0 [8];
  vector<bool,_std::allocator<bool>_> adjacency_nodes_are_used;
  vector<int,_std::allocator<int>_> which_indices_should_be_used_next;
  vector<bool,_std::allocator<bool>_> is_the_used_node_dummy;
  vector<int,_std::allocator<int>_> selected_ids_from_adj;
  bool debug_local;
  vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_> *adj_list_nodes_local;
  map<char,_int,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>
  *from_pattern_id_to_adj_id_map_local;
  vector<int,_std::allocator<int>_> *antecedent_pattern_node_labels_ADDED_local;
  vector<int,_std::allocator<int>_> *antecedent_pattern_node_id_ADDED_local;
  vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
  *antecedent_pattern_edges_ADDED_local;
  AdjacencyListCrate *adjacency_list_local;
  
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)
             &is_the_used_node_dummy.super__Bvector_base<std::allocator<bool>_>._M_impl.
              super__Bvector_impl_data._M_end_of_storage);
  std::vector<bool,_std::allocator<bool>_>::vector
            ((vector<bool,_std::allocator<bool>_> *)
             &which_indices_should_be_used_next.super__Vector_base<int,_std::allocator<int>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)
             &adjacency_nodes_are_used.super__Bvector_base<std::allocator<bool>_>._M_impl.
              super__Bvector_impl_data._M_end_of_storage);
  sVar6 = std::vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>::size
                    (adj_list_nodes);
  local_c1 = false;
  std::allocator<bool>::allocator(&local_c2);
  std::vector<bool,_std::allocator<bool>_>::vector
            ((vector<bool,_std::allocator<bool>_> *)local_c0,sVar6,&local_c1,&local_c2);
  std::allocator<bool>::~allocator(&local_c2);
  local_d8 = 0;
  i._4_4_ = 0;
  i._0_4_ = 0;
  std::vector<int,_std::allocator<int>_>::push_back
            ((vector<int,_std::allocator<int>_> *)
             &adjacency_nodes_are_used.super__Bvector_base<std::allocator<bool>_>._M_impl.
              super__Bvector_impl_data._M_end_of_storage,(value_type *)&i);
  do {
    do {
      sVar6 = std::vector<int,_std::allocator<int>_>::size(antecedent_pattern_node_labels_ADDED);
      if (sVar6 <= (ulong)(long)i._4_4_) {
        local_e8 = 0;
        while( true ) {
          sVar6 = std::vector<int,_std::allocator<int>_>::size(antecedent_pattern_node_id_ADDED);
          if (sVar6 <= local_e8) break;
          pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)
                              &is_the_used_node_dummy.super__Bvector_base<std::allocator<bool>_>.
                               _M_impl.super__Bvector_impl_data._M_end_of_storage,local_e8);
          vVar2 = *pvVar7;
          pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                             (antecedent_pattern_node_id_ADDED,local_e8);
          edge_mapping_sets.
          super__Vector_base<std::set<dgrminer::int_pair,_std::less<dgrminer::int_pair>,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::set<dgrminer::int_pair,_std::less<dgrminer::int_pair>,_std::allocator<dgrminer::int_pair>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = (undefined1)*pvVar7;
          pmVar8 = std::
                   map<char,_int,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>::
                   operator[](from_pattern_id_to_adj_id_map,
                              (key_type_conflict *)
                              ((long)&edge_mapping_sets.
                                      super__Vector_base<std::set<dgrminer::int_pair,_std::less<dgrminer::int_pair>,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::set<dgrminer::int_pair,_std::less<dgrminer::int_pair>,_std::allocator<dgrminer::int_pair>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
          *pmVar8 = vVar2;
          local_e8 = local_e8 + 1;
        }
        this = &maximal_set_of_edges.
                super__Vector_base<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
        std::
        vector<std::set<dgrminer::int_pair,_std::less<dgrminer::int_pair>,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::set<dgrminer::int_pair,_std::less<dgrminer::int_pair>,_std::allocator<dgrminer::int_pair>_>_>_>
        ::vector((vector<std::set<dgrminer::int_pair,_std::less<dgrminer::int_pair>,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::set<dgrminer::int_pair,_std::less<dgrminer::int_pair>,_std::allocator<dgrminer::int_pair>_>_>_>
                  *)this);
        sVar6 = std::vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>::size
                          (adj_list_nodes);
        find_addition_edges(adjacency_list,antecedent_pattern_edges_ADDED,
                            from_pattern_id_to_adj_id_map,(int)sVar6,
                            (vector<std::set<dgrminer::int_pair,_std::less<dgrminer::int_pair>,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::set<dgrminer::int_pair,_std::less<dgrminer::int_pair>,_std::allocator<dgrminer::int_pair>_>_>_>
                             *)this,edges_occupied_by_antecedent,debug);
        std::
        vector<std::set<dgrminer::int_pair,_std::less<dgrminer::int_pair>,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::set<dgrminer::int_pair,_std::less<dgrminer::int_pair>,_std::allocator<dgrminer::int_pair>_>_>_>
        ::vector((vector<std::set<dgrminer::int_pair,_std::less<dgrminer::int_pair>,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::set<dgrminer::int_pair,_std::less<dgrminer::int_pair>,_std::allocator<dgrminer::int_pair>_>_>_>
                  *)&set_of_non_dummy_vertices._M_t._M_impl.super__Rb_tree_header._M_node_count,
                 (vector<std::set<dgrminer::int_pair,_std::less<dgrminer::int_pair>,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::set<dgrminer::int_pair,_std::less<dgrminer::int_pair>,_std::allocator<dgrminer::int_pair>_>_>_>
                  *)&maximal_set_of_edges.
                     super__Vector_base<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
        find_maximal_subsets_of_pairs
                  ((vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
                    *)local_120,
                   (vector<std::set<dgrminer::int_pair,_std::less<dgrminer::int_pair>,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::set<dgrminer::int_pair,_std::less<dgrminer::int_pair>,_std::allocator<dgrminer::int_pair>_>_>_>
                    *)&set_of_non_dummy_vertices._M_t._M_impl.super__Rb_tree_header._M_node_count);
        std::
        vector<std::set<dgrminer::int_pair,_std::less<dgrminer::int_pair>,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::set<dgrminer::int_pair,_std::less<dgrminer::int_pair>,_std::allocator<dgrminer::int_pair>_>_>_>
        ::~vector((vector<std::set<dgrminer::int_pair,_std::less<dgrminer::int_pair>,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::set<dgrminer::int_pair,_std::less<dgrminer::int_pair>,_std::allocator<dgrminer::int_pair>_>_>_>
                   *)&set_of_non_dummy_vertices._M_t._M_impl.super__Rb_tree_header._M_node_count);
        std::set<int,_std::less<int>,_std::allocator<int>_>::set
                  ((set<int,_std::less<int>,_std::allocator<int>_> *)&i_1);
        local_170 = 0;
        while( true ) {
          uVar10 = local_170;
          sVar6 = std::vector<int,_std::allocator<int>_>::size(antecedent_pattern_node_id_ADDED);
          if (sVar6 <= uVar10) break;
          rVar13 = std::vector<bool,_std::allocator<bool>_>::operator[]
                             ((vector<bool,_std::allocator<bool>_> *)
                              &which_indices_should_be_used_next.
                               super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage,local_170);
          local_180 = rVar13;
          bVar4 = std::_Bit_reference::operator_cast_to_bool(&local_180);
          if (((bVar4 ^ 0xffU) & 1) != 0) {
            pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                               (antecedent_pattern_node_id_ADDED,local_170);
            std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                      ((set<int,_std::less<int>,_std::allocator<int>_> *)&i_1,pvVar7);
          }
          local_170 = local_170 + 1;
        }
        set_of_used_edges._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        while( true ) {
          sVar3 = set_of_used_edges._M_t._M_impl.super__Rb_tree_header._M_node_count;
          sVar6 = std::
                  vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
                  ::size((vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
                          *)local_120);
          if (sVar6 <= sVar3) break;
          std::set<int,_std::less<int>,_std::allocator<int>_>::set
                    ((set<int,_std::less<int>,_std::allocator<int>_> *)&j);
          local_1d0 = 0;
          while( true ) {
            pvVar9 = std::
                     vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
                     ::operator[]((vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
                                   *)local_120,
                                  set_of_used_edges._M_t._M_impl.super__Rb_tree_header._M_node_count
                                 );
            sVar6 = std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>::size
                              (pvVar9);
            if (sVar6 <= local_1d0) break;
            pvVar9 = std::
                     vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
                     ::operator[]((vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
                                   *)local_120,
                                  set_of_used_edges._M_t._M_impl.super__Rb_tree_header._M_node_count
                                 );
            __x = std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>::operator[]
                            (pvVar9,local_1d0);
            pVar14 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                               ((set<int,_std::less<int>,_std::allocator<int>_> *)&j,&__x->first);
            ndve.non_dummy_edges._M_t._M_impl.super__Rb_tree_header._M_node_count =
                 (size_t)pVar14.first._M_node;
            local_1d0 = local_1d0 + 1;
          }
          non_dummy_vertices_and_edges::non_dummy_vertices_and_edges
                    ((non_dummy_vertices_and_edges *)local_240);
          std::set<int,_std::less<int>,_std::allocator<int>_>::operator=
                    ((set<int,_std::less<int>,_std::allocator<int>_> *)local_240,
                     (set<int,_std::less<int>,_std::allocator<int>_> *)&i_1);
          std::set<int,_std::less<int>,_std::allocator<int>_>::operator=
                    ((set<int,_std::less<int>,_std::allocator<int>_> *)
                     &ndve.non_dummy_vertices._M_t._M_impl.super__Rb_tree_header._M_node_count,
                     (set<int,_std::less<int>,_std::allocator<int>_> *)&j);
          pVar15 = std::
                   set<dgrminer::non_dummy_vertices_and_edges,_std::less<dgrminer::non_dummy_vertices_and_edges>,_std::allocator<dgrminer::non_dummy_vertices_and_edges>_>
                   ::insert(sets_of_used_edges,(value_type *)local_240);
          _Stack_250 = pVar15.first._M_node;
          local_248 = pVar15.second;
          non_dummy_vertices_and_edges::~non_dummy_vertices_and_edges
                    ((non_dummy_vertices_and_edges *)local_240);
          std::set<int,_std::less<int>,_std::allocator<int>_>::~set
                    ((set<int,_std::less<int>,_std::allocator<int>_> *)&j);
          set_of_used_edges._M_t._M_impl.super__Rb_tree_header._M_node_count =
               set_of_used_edges._M_t._M_impl.super__Rb_tree_header._M_node_count + 1;
        }
        sVar6 = std::vector<int,_std::allocator<int>_>::size(antecedent_pattern_node_id_ADDED);
        if (sVar6 == 0) {
          local_254 = 3;
        }
        else {
          rVar16 = std::vector<bool,_std::allocator<bool>_>::back
                             ((vector<bool,_std::allocator<bool>_> *)
                              &which_indices_should_be_used_next.
                               super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage);
          local_268 = rVar16;
          local_255 = std::_Bit_reference::operator_cast_to_bool(&local_268);
          std::vector<int,_std::allocator<int>_>::pop_back
                    ((vector<int,_std::allocator<int>_> *)
                     &adjacency_nodes_are_used.super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_end_of_storage);
          if ((local_255 & 1) == 0) {
            pvVar7 = std::vector<int,_std::allocator<int>_>::back
                               ((vector<int,_std::allocator<int>_> *)
                                &adjacency_nodes_are_used.super__Bvector_base<std::allocator<bool>_>
                                 ._M_impl.super__Bvector_impl_data._M_end_of_storage);
            rVar13 = std::vector<bool,_std::allocator<bool>_>::operator[]
                               ((vector<bool,_std::allocator<bool>_> *)local_c0,(long)(*pvVar7 + -1)
                               );
            _node_candidate_index = rVar13;
            std::_Bit_reference::operator=((_Bit_reference *)&node_candidate_index,false);
          }
          else {
            local_d8 = local_d8 + -1;
          }
          std::vector<bool,_std::allocator<bool>_>::pop_back
                    ((vector<bool,_std::allocator<bool>_> *)
                     &which_indices_should_be_used_next.
                      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                      _M_end_of_storage);
          std::vector<int,_std::allocator<int>_>::pop_back
                    ((vector<int,_std::allocator<int>_> *)
                     &is_the_used_node_dummy.super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_end_of_storage);
          i._4_4_ = i._4_4_ + -1;
          local_254 = 0;
        }
        std::set<int,_std::less<int>,_std::allocator<int>_>::~set
                  ((set<int,_std::less<int>,_std::allocator<int>_> *)&i_1);
        std::
        vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
        ::~vector((vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
                   *)local_120);
        std::
        vector<std::set<dgrminer::int_pair,_std::less<dgrminer::int_pair>,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::set<dgrminer::int_pair,_std::less<dgrminer::int_pair>,_std::allocator<dgrminer::int_pair>_>_>_>
        ::~vector((vector<std::set<dgrminer::int_pair,_std::less<dgrminer::int_pair>,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::set<dgrminer::int_pair,_std::less<dgrminer::int_pair>,_std::allocator<dgrminer::int_pair>_>_>_>
                   *)&maximal_set_of_edges.
                      super__Vector_base<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
        if (local_254 != 0) goto LAB_001913e3;
      }
      is_occupied_by_frequent_pattern = true;
      pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)
                          &adjacency_nodes_are_used.super__Bvector_base<std::allocator<bool>_>.
                           _M_impl.super__Bvector_impl_data._M_end_of_storage,(long)i._4_4_);
      local_280 = *pvVar7;
      while( true ) {
        uVar10 = (ulong)local_280;
        sVar6 = std::vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>::size
                          (adj_list_nodes);
        if (sVar6 <= uVar10) break;
        pvVar11 = std::vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>::
                  operator[](adj_list_nodes,(long)local_280);
        pvVar12 = std::array<int,_3UL>::operator[](pvVar11,0);
        local_290._M_node =
             (_Base_ptr)
             std::set<int,_std::less<int>,_std::allocator<int>_>::find
                       (nodes_occupied_by_antecedent,pvVar12);
        local_298._M_node =
             (_Base_ptr)
             std::set<int,_std::less<int>,_std::allocator<int>_>::end(nodes_occupied_by_antecedent);
        local_281 = std::operator!=(&local_290,&local_298);
        rVar13 = std::vector<bool,_std::allocator<bool>_>::operator[]
                           ((vector<bool,_std::allocator<bool>_> *)local_c0,(long)local_280);
        _auStack_2a8 = rVar13;
        bVar4 = std::_Bit_reference::operator_cast_to_bool((_Bit_reference *)auStack_2a8);
        local_3e9 = 0;
        if (!bVar4) {
          local_3e9 = local_281 ^ 0xff;
        }
        if ((local_3e9 & 1) != 0) {
          pvVar11 = std::vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>::
                    operator[](adj_list_nodes,(long)local_280);
          pvVar12 = std::array<int,_3UL>::operator[](pvVar11,2);
          iVar5 = *pvVar12;
          pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                             (antecedent_pattern_node_labels_ADDED,(long)i._4_4_);
          local_2a9 = iVar5 == *pvVar7;
          if ((bool)local_2a9) {
            is_occupied_by_frequent_pattern = false;
            iVar5 = local_280 + 1;
            ppuVar1 = &adjacency_nodes_are_used.super__Bvector_base<std::allocator<bool>_>._M_impl.
                       super__Bvector_impl_data._M_end_of_storage;
            pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                               ((vector<int,_std::allocator<int>_> *)ppuVar1,(long)i._4_4_);
            *pvVar7 = iVar5;
            local_2b0 = 0;
            std::vector<int,_std::allocator<int>_>::push_back
                      ((vector<int,_std::allocator<int>_> *)ppuVar1,&local_2b0);
            std::vector<bool,_std::allocator<bool>_>::push_back
                      ((vector<bool,_std::allocator<bool>_> *)
                       &which_indices_should_be_used_next.
                        super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage,false);
            pvVar11 = std::vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>::
                      operator[](adj_list_nodes,(long)local_280);
            pvVar12 = std::array<int,_3UL>::operator[](pvVar11,0);
            std::vector<int,_std::allocator<int>_>::push_back
                      ((vector<int,_std::allocator<int>_> *)
                       &is_the_used_node_dummy.super__Bvector_base<std::allocator<bool>_>._M_impl.
                        super__Bvector_impl_data._M_end_of_storage,pvVar12);
            rVar13 = std::vector<bool,_std::allocator<bool>_>::operator[]
                               ((vector<bool,_std::allocator<bool>_> *)local_c0,(long)local_280);
            local_2c0 = rVar13;
            std::_Bit_reference::operator=(&local_2c0,true);
            i._4_4_ = i._4_4_ + 1;
            break;
          }
        }
        local_280 = local_280 + 1;
      }
      if ((is_occupied_by_frequent_pattern & 1U) != 0) {
        pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)
                            &adjacency_nodes_are_used.super__Bvector_base<std::allocator<bool>_>.
                             _M_impl.super__Bvector_impl_data._M_end_of_storage,(long)i._4_4_);
        iVar5 = *pvVar7;
        sVar6 = std::vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>::size
                          (adj_list_nodes);
        if ((ulong)(long)iVar5 <= sVar6) {
          sVar6 = std::vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>::size
                            (adj_list_nodes);
          ppuVar1 = &adjacency_nodes_are_used.super__Bvector_base<std::allocator<bool>_>._M_impl.
                     super__Bvector_impl_data._M_end_of_storage;
          pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)ppuVar1,(long)i._4_4_);
          *pvVar7 = (int)sVar6 + 1;
          vStack_2c4 = 0;
          std::vector<int,_std::allocator<int>_>::push_back
                    ((vector<int,_std::allocator<int>_> *)ppuVar1,&stack0xfffffffffffffd3c);
          std::vector<bool,_std::allocator<bool>_>::push_back
                    ((vector<bool,_std::allocator<bool>_> *)
                     &which_indices_should_be_used_next.
                      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                      _M_end_of_storage,true);
          sVar6 = std::vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>::size
                            (adj_list_nodes);
          local_2c8 = (int)sVar6 + local_d8;
          std::vector<int,_std::allocator<int>_>::push_back
                    ((vector<int,_std::allocator<int>_> *)
                     &is_the_used_node_dummy.super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_end_of_storage,&local_2c8);
          local_d8 = local_d8 + 1;
          i._4_4_ = i._4_4_ + 1;
        }
      }
      if (0 < i._4_4_) {
        pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)
                            &adjacency_nodes_are_used.super__Bvector_base<std::allocator<bool>_>.
                             _M_impl.super__Bvector_impl_data._M_end_of_storage,(long)i._4_4_);
        iVar5 = *pvVar7;
        sVar6 = std::vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>::size
                          (adj_list_nodes);
        if (sVar6 < (ulong)(long)iVar5) {
          rVar16 = std::vector<bool,_std::allocator<bool>_>::back
                             ((vector<bool,_std::allocator<bool>_> *)
                              &which_indices_should_be_used_next.
                               super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage);
          local_2e0 = rVar16;
          local_2c9 = std::_Bit_reference::operator_cast_to_bool(&local_2e0);
          std::vector<int,_std::allocator<int>_>::pop_back
                    ((vector<int,_std::allocator<int>_> *)
                     &adjacency_nodes_are_used.super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_end_of_storage);
          if ((local_2c9 & 1) == 0) {
            pvVar7 = std::vector<int,_std::allocator<int>_>::back
                               ((vector<int,_std::allocator<int>_> *)
                                &adjacency_nodes_are_used.super__Bvector_base<std::allocator<bool>_>
                                 ._M_impl.super__Bvector_impl_data._M_end_of_storage);
            rVar13 = std::vector<bool,_std::allocator<bool>_>::operator[]
                               ((vector<bool,_std::allocator<bool>_> *)local_c0,(long)(*pvVar7 + -1)
                               );
            local_2f0 = rVar13;
            std::_Bit_reference::operator=(&local_2f0,false);
          }
          else {
            local_d8 = local_d8 + -1;
          }
          std::vector<bool,_std::allocator<bool>_>::pop_back
                    ((vector<bool,_std::allocator<bool>_> *)
                     &which_indices_should_be_used_next.
                      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                      _M_end_of_storage);
          std::vector<int,_std::allocator<int>_>::pop_back
                    ((vector<int,_std::allocator<int>_> *)
                     &is_the_used_node_dummy.super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_end_of_storage);
          i._4_4_ = i._4_4_ + -1;
        }
      }
    } while (i._4_4_ != 0);
    pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)
                        &adjacency_nodes_are_used.super__Bvector_base<std::allocator<bool>_>._M_impl
                         .super__Bvector_impl_data._M_end_of_storage,0);
    iVar5 = *pvVar7;
    sVar6 = std::vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>::size
                      (adj_list_nodes);
  } while ((ulong)(long)iVar5 <= sVar6);
LAB_001913e3:
  std::vector<bool,_std::allocator<bool>_>::~vector((vector<bool,_std::allocator<bool>_> *)local_c0)
  ;
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)
             &adjacency_nodes_are_used.super__Bvector_base<std::allocator<bool>_>._M_impl.
              super__Bvector_impl_data._M_end_of_storage);
  std::vector<bool,_std::allocator<bool>_>::~vector
            ((vector<bool,_std::allocator<bool>_> *)
             &which_indices_should_be_used_next.super__Vector_base<int,_std::allocator<int>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)
             &is_the_used_node_dummy.super__Bvector_base<std::allocator<bool>_>._M_impl.
              super__Bvector_impl_data._M_end_of_storage);
  return;
}

Assistant:

void find_addition_nodes_and_edges(AdjacencyListCrate & adjacency_list, std::vector<std::array<int, PAT___SIZE>> & antecedent_pattern_edges_ADDED,
		std::vector<int> & antecedent_pattern_node_id_ADDED,
		std::vector<int> & antecedent_pattern_node_labels_ADDED,
		std::map<char, int> & from_pattern_id_to_adj_id_map,
		std::vector<std::array<int, ADJ_NODES___SIZE>> & adj_list_nodes,
		std::set<non_dummy_vertices_and_edges> & sets_of_used_edges,
		std::set<int> & nodes_occupied_by_antecedent, std::set<int> & edges_occupied_by_antecedent,
		bool debug)
	{
		// first, try to find the addition nodes:

		std::vector<int> selected_ids_from_adj; // which IDS of adj nodes correspond to those in antecedent_pattern_isolated_node_id
		std::vector<bool> is_the_used_node_dummy;
		std::vector<int> which_indices_should_be_used_next; // here we save the currently used indices for backtracking
		std::vector<bool> adjacency_nodes_are_used(adj_list_nodes.size(), false); // here we save which nodes from the adjacency list are already used

		int number_of_created_dummy_vertices = 0;

		int isolated_vertex_current_index_ADDED = 0; // we want to process the the first isolated vertex
		which_indices_should_be_used_next.push_back(0); // for the first isolated node, we want to start from the first node of adjacency list

		// DO DFS:
		while (true)
		{

			// if all isolated ADDITION nodes were mapped:
			if (antecedent_pattern_node_labels_ADDED.size() <= isolated_vertex_current_index_ADDED)
			{
				// we don't need to check whether there are no addition edges - we wouldn't get here from the outer function
				// process the addition edges:

				// CREATE MAPPING: PATTERN ANTECEDENT IDS -> selected_ids_from_adj
				for (size_t i = 0; i < antecedent_pattern_node_id_ADDED.size(); i++)
				{
					from_pattern_id_to_adj_id_map[antecedent_pattern_node_id_ADDED[i]] = selected_ids_from_adj[i];
				}
				// FINALLY, FIND MAPPING OF ADDITION EDGES:
				std::vector<std::set<int_pair>> edge_mapping_sets;
				find_addition_edges(adjacency_list, antecedent_pattern_edges_ADDED, from_pattern_id_to_adj_id_map,
					adj_list_nodes.size(), edge_mapping_sets, edges_occupied_by_antecedent, debug);

				std::vector<std::vector<int_pair>> maximal_set_of_edges = find_maximal_subsets_of_pairs(edge_mapping_sets);

				// get the set of non_dummy_vertices:
				std::set<int> set_of_non_dummy_vertices;
				for (size_t i = 0; i < antecedent_pattern_node_id_ADDED.size(); i++)
				{
					if (!is_the_used_node_dummy[i])
					{
						set_of_non_dummy_vertices.insert(antecedent_pattern_node_id_ADDED[i]);
					}
				}

				// SAVE the used pattern edges to a set
				for (size_t i = 0; i < maximal_set_of_edges.size(); i++)
				{
					std::set<int> set_of_used_edges;
					for (size_t j = 0; j < maximal_set_of_edges[i].size(); j++)
					{
						set_of_used_edges.insert(maximal_set_of_edges[i][j].first);
					}
					non_dummy_vertices_and_edges ndve;
					ndve.non_dummy_vertices = set_of_non_dummy_vertices;
					ndve.non_dummy_edges = set_of_used_edges;

					sets_of_used_edges.insert(ndve);
				}

				// if there were no ADDITION ISOLATED NODES, just finish the DFS:
				if (antecedent_pattern_node_id_ADDED.size() == 0) {
					break;
				}

				// else BACKTRACK:

				bool was_the_node_dummy = is_the_used_node_dummy.back();
				which_indices_should_be_used_next.pop_back();

				if (was_the_node_dummy)
				{
					number_of_created_dummy_vertices--;
				}
				else
				{
					adjacency_nodes_are_used[which_indices_should_be_used_next.back() - 1] = false;
				}
				is_the_used_node_dummy.pop_back();
				selected_ids_from_adj.pop_back();
				isolated_vertex_current_index_ADDED--;

			}
            // Nodes were not matched yet

			bool should_try_dummy = true;
			// try to find matching addition node:
			int node_candidate_index = which_indices_should_be_used_next[isolated_vertex_current_index_ADDED];
			for (; node_candidate_index < adj_list_nodes.size(); node_candidate_index++)
			{
				bool is_occupied_by_frequent_pattern = nodes_occupied_by_antecedent.find(adj_list_nodes[node_candidate_index][ADJ_NODES_ID]) != nodes_occupied_by_antecedent.end();
				// if the current adjacency node wasn't used yet:
				if (!adjacency_nodes_are_used[node_candidate_index] && !is_occupied_by_frequent_pattern)
				{
					// if it is same as that isolated vertex:
					// (we must take the antecedent info of both nodes)
					bool are_same = adj_list_nodes[node_candidate_index][ADJ_NODES_LABEL] == antecedent_pattern_node_labels_ADDED[isolated_vertex_current_index_ADDED];

					if (are_same)
					{
						//if (debug) cout << "Found node match: " << isolated_vertex_current_index_ADDED <<
						//	"-th addition vertex to adj. vertex with ID: " << adj_list_nodes[node_candidate_index][ADJ_NODES_ID] << endl;
						//cout << "DOING FINDING MATCHING: " << endl;

						should_try_dummy = false;
						which_indices_should_be_used_next[isolated_vertex_current_index_ADDED] = node_candidate_index + 1;
						which_indices_should_be_used_next.push_back(0);
						is_the_used_node_dummy.push_back(false);
						selected_ids_from_adj.push_back(adj_list_nodes[node_candidate_index][ADJ_NODES_ID]);

						adjacency_nodes_are_used[node_candidate_index] = true;
						isolated_vertex_current_index_ADDED++;
						break;
					}
				}
			}
			// if we tried all regular nodes and should backtrack, try to map to a dummy vertex first:
			if (should_try_dummy && which_indices_should_be_used_next[isolated_vertex_current_index_ADDED] <= adj_list_nodes.size())
			{
				//if (debug) cout << "Matching " << isolated_vertex_current_index_ADDED <<
				//	"-th addition vertex to a new dummy vertex with ID: " << (adj_list_nodes.size() + number_of_created_dummy_vertices) << endl;

				which_indices_should_be_used_next[isolated_vertex_current_index_ADDED] = adj_list_nodes.size() + 1; // just mark there the size + 1
				which_indices_should_be_used_next.push_back(0);
				is_the_used_node_dummy.push_back(true);
				// selected_ids_from_adj.push_back(adj_list_nodes[node_candidate_index][ADJ_NODES_ID]);
				//mark down the new ID of the dummy:
				//cout << "USING adj_list_nodes.size() = " << adj_list_nodes.size() << ", number_of_created_dummy_vertices = " << number_of_created_dummy_vertices << endl;

				selected_ids_from_adj.push_back(adj_list_nodes.size() + number_of_created_dummy_vertices);
				number_of_created_dummy_vertices++;
				isolated_vertex_current_index_ADDED++;
			}


			if (isolated_vertex_current_index_ADDED > 0 && which_indices_should_be_used_next[isolated_vertex_current_index_ADDED] > adj_list_nodes.size())
			{
				// BACKTRACK:
				// now we also tried the dummy one, so really backtrack

				bool was_the_node_dummy = is_the_used_node_dummy.back();

				which_indices_should_be_used_next.pop_back();
				if (was_the_node_dummy)
				{
					number_of_created_dummy_vertices--;
				}
				else
				{
					adjacency_nodes_are_used[which_indices_should_be_used_next.back() - 1] = false;
				}

				//cout << "DOING FINAL BACKTRACK: " << endl;

				is_the_used_node_dummy.pop_back();
				selected_ids_from_adj.pop_back();
				isolated_vertex_current_index_ADDED--;
			}

			if (isolated_vertex_current_index_ADDED == 0 && which_indices_should_be_used_next[isolated_vertex_current_index_ADDED] > adj_list_nodes.size())
			{
				// we tried all combinations, just end:
				break;
			}
		}
	}